

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

FloatTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetFloatTextureOrNull
          (TextureParameterDictionary *this,string *name,Allocator alloc)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar3;
  uintptr_t iptr;
  const_iterator cVar4;
  Float *pFVar5;
  long *in_RCX;
  ParameterDictionary *pPVar6;
  char *fmt;
  long lVar7;
  pointer pcVar8;
  Float FVar9;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar8 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar8 = *(pointer *)(pcVar1 + 8);
  }
  lVar7 = 0;
  do {
    if (lVar2 << 3 == lVar7) {
      pPVar6 = (ParameterDictionary *)0x0;
LAB_00281292:
      this->dict = pPVar6;
      return (FloatTextureHandle)
             (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              )this;
    }
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pcVar8 + lVar7);
    bVar3 = std::operator!=(__lhs + 1,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            alloc.memoryResource);
    if (!bVar3) {
      bVar3 = std::operator==(__lhs,"texture");
      if (bVar3) {
        if (__lhs[4].field_2._M_allocated_capacity != 1) {
          if (__lhs[4].field_2._M_allocated_capacity == 0) {
            fmt = "No texture name provided for parameter \"%s\".";
          }
          else {
            fmt = "More than one texture name provided for parameter \"%s\".";
          }
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)(__lhs + 2),fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     alloc.memoryResource);
        }
        __lhs[5].field_2._M_local_buf[8] = '\x01';
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                        *)name->_M_string_length,(key_type *)__lhs[4]._M_dataplus._M_p);
        if (cVar4._M_node == (_Base_ptr)(name->_M_string_length + 8)) {
          ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((FileLoc *)(__lhs + 2),
                     "Couldn\'t find float texture named \"%s\" for parameter \"%s\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __lhs[4]._M_dataplus._M_p,__lhs + 1);
        }
        pPVar6 = *(ParameterDictionary **)(cVar4._M_node + 2);
        goto LAB_00281292;
      }
      bVar3 = std::operator==(__lhs,"float");
      if (bVar3) {
        FVar9 = GetOneFloat((TextureParameterDictionary *)name,(string *)alloc.memoryResource,0.0);
        pFVar5 = (Float *)(**(code **)(*in_RCX + 0x10))(in_RCX,4);
        pPVar6 = (ParameterDictionary *)((ulong)pFVar5 | 0x5000000000000);
        *pFVar5 = FVar9;
        goto LAB_00281292;
      }
    }
    lVar7 = lVar7 + 8;
  } while( true );
}

Assistant:

FloatTextureHandle TextureParameterDictionary::GetFloatTextureOrNull(
    const std::string &name, Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = floatTextures->find(p->strings[0]);
            if (iter != floatTextures->end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find float texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "float") {
            Float v = GetOneFloat(name, 0.f);  // we know this will be found
            return alloc.new_object<FloatConstantTexture>(v);
        }
    }

    return nullptr;
}